

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysym2Ucs.c
# Opt level: O0

long XKeysymToUcs(KeySym keysym)

{
  uint uVar1;
  KeySym keysym_local;
  
  uVar1 = KeySymToUcs4(keysym);
  return (ulong)uVar1;
}

Assistant:

long XKeysymToUcs(KeySym keysym) {
  return (long) KeySymToUcs4(keysym);
}